

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpInitCtxt(xmlDebugCtxtPtr ctxt)

{
  int local_14;
  int i;
  xmlDebugCtxtPtr ctxt_local;
  
  ctxt->depth = 0;
  ctxt->check = 0;
  ctxt->errors = 0;
  ctxt->output = _stdout;
  ctxt->doc = (xmlDocPtr)0x0;
  ctxt->node = (xmlNodePtr)0x0;
  ctxt->dict = (xmlDictPtr)0x0;
  ctxt->nodict = 0;
  ctxt->options = 0;
  for (local_14 = 0; local_14 < 100; local_14 = local_14 + 1) {
    ctxt->shift[local_14] = ' ';
  }
  ctxt->shift[100] = '\0';
  return;
}

Assistant:

static void
xmlCtxtDumpInitCtxt(xmlDebugCtxtPtr ctxt)
{
    int i;

    ctxt->depth = 0;
    ctxt->check = 0;
    ctxt->errors = 0;
    ctxt->output = stdout;
    ctxt->doc = NULL;
    ctxt->node = NULL;
    ctxt->dict = NULL;
    ctxt->nodict = 0;
    ctxt->options = 0;
    for (i = 0; i < 100; i++)
        ctxt->shift[i] = ' ';
    ctxt->shift[100] = 0;
}